

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O1

void adt_u32List_destroy(adt_u32List_t *self)

{
  adt_u32List_elem_tag *paVar1;
  adt_u32List_elem_t *__ptr;
  
  if (self != (adt_u32List_t *)0x0) {
    __ptr = self->pFirst;
    while (__ptr != (adt_u32List_elem_t *)0x0) {
      paVar1 = __ptr->pNext;
      free(__ptr);
      __ptr = paVar1;
    }
  }
  return;
}

Assistant:

void  adt_u32List_destroy(adt_u32List_t *self)
{
   if (self != 0)
   {
      adt_u32List_elem_t *iter = self->pFirst;
      if (iter == 0)
      {
         return; //empty list
      }
      while( iter != 0 )
      {
         adt_u32List_elem_t *pNext = iter->pNext;
         adt_u32List_elem_delete(iter);
         iter=pNext;
      }
   }
}